

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse_dispatch_loop.h
# Opt level: O2

void parse_dispatch(vw *all,dispatch_fptr *dispatch)

{
  int iVar1;
  ulong uVar2;
  ulong uVar3;
  v_array<example_*> examples;
  example *local_60;
  v_array<example_*> local_58;
  
  local_58.end_array = (example **)0x0;
  local_58.erase_count = 0;
  local_58._begin = (example **)0x0;
  local_58._end = (example **)0x0;
  uVar2 = 0;
  do {
    if (all->p->done != false) {
      lock_done(all->p);
      v_array<example_*>::delete_v(&local_58);
      return;
    }
    local_60 = VW::get_unused_example(all);
    v_array<example_*>::push_back(&local_58,&local_60);
    if (((all->do_reset_source == false) && (uVar2 != all->pass_length)) &&
       (uVar2 < all->max_examples)) {
      iVar1 = (*all->p->reader)(all,&local_58);
      if (iVar1 < 1) goto LAB_0017777e;
      VW::setup_examples(all,&local_58);
      uVar3 = uVar2 + ((long)local_58._end - (long)local_58._begin >> 3);
      std::function<void_(vw_&,_v_array<example_*>_&)>::operator()(dispatch,all,&local_58);
    }
    else {
LAB_0017777e:
      reset_source(all,(ulong)all->num_bits);
      all->do_reset_source = false;
      all->passes_complete = all->passes_complete + 1;
      (*(all->p->lp).default_label)(&(*local_58._begin)->l);
      (*local_58._begin)->end_pass = true;
      all->p->in_pass_counter = 0;
      if ((all->passes_complete == all->numpasses) && (uVar2 == all->pass_length)) {
        all->passes_complete = 0;
        all->pass_length = uVar2 * 2 + 1;
      }
      std::function<void_(vw_&,_v_array<example_*>_&)>::operator()(dispatch,all,&local_58);
      if (all->numpasses <= all->passes_complete) {
        uVar3 = 0;
        if (all->max_examples < uVar2) goto LAB_0017782d;
        lock_done(all->p);
      }
      uVar3 = 0;
    }
LAB_0017782d:
    v_array<example_*>::clear(&local_58);
    uVar2 = uVar3;
  } while( true );
}

Assistant:

inline void parse_dispatch(vw& all, dispatch_fptr dispatch)
{
  v_array<example*> examples = v_init<example*>();
  size_t example_number = 0;  // for variable-size batch learning algorithms

  try
  {
    while (!all.p->done)
    {
      examples.push_back(&VW::get_unused_example(&all));  // need at least 1 example
      if (!all.do_reset_source && example_number != all.pass_length && all.max_examples > example_number &&
          all.p->reader(&all, examples) > 0)
      {
        VW::setup_examples(all, examples);
        example_number += examples.size();
        dispatch(all, examples);
      }
      else
      {
        reset_source(all, all.num_bits);
        all.do_reset_source = false;
        all.passes_complete++;

        // setup an end_pass example
        all.p->lp.default_label(&examples[0]->l);
        examples[0]->end_pass = true;
        all.p->in_pass_counter = 0;

        if (all.passes_complete == all.numpasses && example_number == all.pass_length)
        {
          all.passes_complete = 0;
          all.pass_length = all.pass_length * 2 + 1;
        }
        dispatch(all, examples);  // must be called before lock_done or race condition exists.
        if (all.passes_complete >= all.numpasses && all.max_examples >= example_number)
          lock_done(*all.p);
        example_number = 0;
      }

      examples.clear();
    }
  }
  catch (VW::vw_exception& e)
  {
    std::cerr << "vw example #" << example_number << "(" << e.Filename() << ":" << e.LineNumber() << "): " << e.what()
              << std::endl;
  }
  catch (std::exception& e)
  {
    std::cerr << "vw: example #" << example_number << e.what() << std::endl;
  }
  lock_done(*all.p);
  examples.delete_v();
}